

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O2

void mxx::impl::gatherv_big<int>
               (int *data,size_t size,int *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,int root,comm *comm
               )

{
  MPI_Comm poVar1;
  MPI_Datatype poVar2;
  MPI_Request *ppoVar3;
  ulong uVar4;
  datatype *__stat_loc;
  long lVar5;
  datatype dt_1;
  datatype dt;
  requests reqs;
  
  reqs._vptr_requests = (_func_int **)&PTR__requests_00166340;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (comm->m_rank == root) {
    lVar5 = 0;
    __stat_loc = (datatype *)size;
    for (uVar4 = 0; (long)uVar4 < (long)comm->m_size; uVar4 = uVar4 + 1) {
      dt_1._vptr_datatype = (_func_int **)&PTR__datatype_00166310;
      dt_1.mpitype = (MPI_Datatype)&ompi_mpi_int;
      dt_1.builtin = true;
      __stat_loc = &dt_1;
      datatype::contiguous
                (&dt,&dt_1,
                 (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar4]);
      datatype::~datatype(&dt_1);
      poVar2 = dt.mpitype;
      if ((uint)root == uVar4) {
        if (size != 0) {
          __stat_loc = (datatype *)data;
          memmove(out + lVar5,data,size * 4);
        }
      }
      else {
        poVar1 = comm->mpi_comm;
        ppoVar3 = requests::add(&reqs);
        __stat_loc = (datatype *)0x1;
        MPI_Irecv(out + lVar5,1,poVar2,uVar4 & 0xffffffff,0x4d2,poVar1,ppoVar3);
      }
      lVar5 = lVar5 + (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar4];
      datatype::~datatype(&dt);
    }
  }
  else {
    dt_1._vptr_datatype = (_func_int **)&PTR__datatype_00166310;
    dt_1.mpitype = (MPI_Datatype)&ompi_mpi_int;
    dt_1.builtin = true;
    datatype::contiguous(&dt,&dt_1,size);
    datatype::~datatype(&dt_1);
    poVar1 = comm->mpi_comm;
    ppoVar3 = requests::add(&reqs);
    __stat_loc = (datatype *)0x1;
    MPI_Isend(data,1,dt.mpitype,(ulong)(uint)root,0x4d2,poVar1,ppoVar3);
    datatype::~datatype(&dt);
  }
  requests::wait(&reqs,__stat_loc);
  requests::~requests(&reqs);
  return;
}

Assistant:

void gatherv_big(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::requests reqs;
    int tag = 1234; // TODO: handle tags somewhere (as attributes in the comm?)
    if (comm.rank() == root) {
        size_t offset = 0;
        for (int i = 0; i < comm.size(); ++i) {
            mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[i]);
            if (i == root) {
                // copy input into output
                std::copy(data, data+size, out+offset);
            } else {
                MPI_Irecv(const_cast<T*>(out)+offset, 1, dt.type(), i, tag, comm, &reqs.add());
            }
            offset += recv_sizes[i];
        }
    } else {
        // create custom datatype to encapsulate the whole message
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
        MPI_Isend(const_cast<T*>(data), 1, dt.type(), root, tag, comm, &reqs.add());
    }
    reqs.wait();
}